

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_util.c
# Opt level: O0

void print_instsv_table(dlog_mt_install_params_t *instsv_table)

{
  char *pcVar1;
  char local_28 [8];
  char phone_number_string [21];
  dlog_mt_install_params_t *instsv_table_local;
  
  unique0x10000220 = instsv_table;
  pcVar1 = phone_num_to_string(local_28,0x15,instsv_table->access_code,4);
  printf("             Access code: %s\n",pcVar1);
  pcVar1 = phone_num_to_string(local_28,0x15,stack0xfffffffffffffff0->key_card_number,5);
  printf("         Key card number: %s\n",pcVar1);
  printf("                   flags: 0x%02x\t",(ulong)stack0xfffffffffffffff0->flags);
  print_bits(stack0xfffffffffffffff0->flags,instsv_flags_bits_str);
  printf("\n");
  printf("         TX Packet Delay: 0x%02x (%dms)\n",(ulong)stack0xfffffffffffffff0->tx_packet_delay
         ,(ulong)((uint)stack0xfffffffffffffff0->tx_packet_delay * 10));
  printf("           RX Packet Gap: 0x%02x (%dms)\n",(ulong)stack0xfffffffffffffff0->rx_packet_gap,
         (ulong)((uint)stack0xfffffffffffffff0->rx_packet_gap * 10));
  printf("       Retries until OOS: %d\n",(ulong)stack0xfffffffffffffff0->retries_until_oos);
  printf("      Coin service flags: 0x%02x\n",(ulong)stack0xfffffffffffffff0->coin_service_flags);
  printf("    Coinbox lock timeout: %d seconds\n",
         (ulong)stack0xfffffffffffffff0->coinbox_lock_timeout);
  pcVar1 = callscrn_num_to_string(local_28,0x15,stack0xfffffffffffffff0->predial_string,4);
  printf("          Predial string: %s\n",pcVar1);
  pcVar1 = callscrn_num_to_string(local_28,0x15,stack0xfffffffffffffff0->predial_string_alt,4);
  printf("Alternate Predial string: %s\n",pcVar1);
  return;
}

Assistant:

void print_instsv_table(dlog_mt_install_params_t* instsv_table) {
    char phone_number_string[21];

    printf("             Access code: %s\n",
        phone_num_to_string(phone_number_string, sizeof(phone_number_string),
            instsv_table->access_code, sizeof(instsv_table->access_code)));
    printf("         Key card number: %s\n",
        phone_num_to_string(phone_number_string, sizeof(phone_number_string),
            instsv_table->key_card_number, sizeof(instsv_table->key_card_number)));
    printf("                   flags: 0x%02x\t", instsv_table->flags);
    print_bits(instsv_table->flags, (char**)instsv_flags_bits_str);
    printf("\n");
    printf("         TX Packet Delay: 0x%02x (%dms)\n",
        instsv_table->tx_packet_delay, instsv_table->tx_packet_delay * 10);
    printf("           RX Packet Gap: 0x%02x (%dms)\n",
        instsv_table->rx_packet_gap, instsv_table->rx_packet_gap * 10);
    printf("       Retries until OOS: %d\n", instsv_table->retries_until_oos);
    printf("      Coin service flags: 0x%02x\n", instsv_table->coin_service_flags);
    printf("    Coinbox lock timeout: %d seconds\n", LE16(instsv_table->coinbox_lock_timeout));
    printf("          Predial string: %s\n",
        callscrn_num_to_string(phone_number_string, sizeof(phone_number_string),
            instsv_table->predial_string, sizeof(instsv_table->predial_string)));
    printf("Alternate Predial string: %s\n",
        callscrn_num_to_string(phone_number_string, sizeof(phone_number_string),
            instsv_table->predial_string_alt, sizeof(instsv_table->predial_string_alt)));
}